

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFFile.cpp
# Opt level: O3

void __thiscall Preferences::PDFFile::render(PDFFile *this,bool shown)

{
  PDFFile *pPVar1;
  pointer pcVar2;
  bool bVar3;
  undefined7 in_register_00000031;
  string pdfFilePath;
  path path;
  string local_90;
  path local_70;
  long *local_48 [2];
  long local_38 [2];
  
  if ((int)CONCAT71(in_register_00000031,shown) != 0) {
    if (!render::wasShown) {
      pPVar1 = this->pdfFile;
      std::filesystem::__cxx11::path::operator=(&(this->pdfFileCopy).path,&pPVar1->path);
      std::filesystem::__cxx11::path::operator=
                (&(this->pdfFileCopy).configFilepath,&pPVar1->configFilepath);
      (this->pdfFileCopy).pdfBridge = pPVar1->pdfBridge;
    }
    ImGui::Text("PDF file settings");
    pcVar2 = (this->pdfFile->path)._M_pathname._M_dataplus._M_p;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,pcVar2,
               pcVar2 + (this->pdfFile->path)._M_pathname._M_string_length);
    bVar3 = ImGui::InputText("PDF File",&local_90,0,(ImGuiInputTextCallback)0x0,(void *)0x0);
    if (bVar3) {
      std::filesystem::__cxx11::path::operator=(&this->pdfFile->path,&local_90);
    }
    ImGui::SameLine(0.0,-1.0);
    local_70._M_pathname._M_dataplus._M_p = (pointer)0x0;
    bVar3 = ImGui::Button("Browse##pdfFilePath",(ImVec2 *)&local_70);
    if (bVar3) {
      show_file_picker_abi_cxx11_(&local_70,false);
      if (local_70._M_pathname._M_string_length != 0) {
        local_48[0] = local_38;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_48,local_70._M_pathname._M_dataplus._M_p,
                   local_70._M_pathname._M_dataplus._M_p + local_70._M_pathname._M_string_length);
        std::__cxx11::string::operator=((string *)&local_90,(string *)local_48);
        if (local_48[0] != local_38) {
          operator_delete(local_48[0],local_38[0] + 1);
        }
        std::filesystem::__cxx11::path::operator=(&this->pdfFile->path,&local_70);
      }
      std::filesystem::__cxx11::path::~path(&local_70);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
  }
  render::wasShown = shown;
  return;
}

Assistant:

void PDFFile::render(bool shown) {
	static bool wasShown = false;

	if (shown) {
		if (!wasShown) { // Panel just got opened
			pdfFileCopy = pdfFile; // Make a copy to be able to restore if cancelled
		}

		ImGui::Text("PDF file settings");

		std::string pdfFilePath = pdfFile.path.string();
		if (ImGui::InputText("PDF File", &pdfFilePath)) {
			pdfFile.path = pdfFilePath;
		}
		ImGui::SameLine();
		if (ImGui::Button("Browse##pdfFilePath")) {
			auto path = show_file_picker();
			if (!path.empty()) {
				pdfFilePath = path.string();
				pdfFile.path = path;
			}
		}
	}

	wasShown = shown;
}